

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O3

bool __thiscall QErrorMessagePrivate::nextPending(QErrorMessagePrivate *this)

{
  _Elt_pointer pMVar1;
  _Elt_pointer pMVar2;
  _Elt_pointer pMVar3;
  qsizetype qVar4;
  undefined1 *puVar5;
  QArrayData *pQVar6;
  char16_t *pcVar7;
  QArrayData *pQVar8;
  char16_t *pcVar9;
  bool bVar10;
  long in_FS_OFFSET;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    pMVar1 = (this->pending).c.
             super__Deque_base<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pMVar2 = (this->pending).c.
             super__Deque_base<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pMVar2 == pMVar1) break;
    local_58.d.d = (pMVar1->content).d.d;
    local_58.d.ptr = (pMVar1->content).d.ptr;
    (pMVar1->content).d.d = (Data *)0x0;
    (pMVar1->content).d.ptr = (char16_t *)0x0;
    local_58.d.size = (pMVar1->content).d.size;
    (pMVar1->content).d.size = 0;
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pMVar3 = (this->pending).c.
             super__Deque_base<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->pending).c.
        super__Deque_base<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == pMVar3) {
      nextPending();
      goto LAB_004dae9d;
    }
    local_78.d.d = (pMVar3->type).d.d;
    local_78.d.ptr = (pMVar3->type).d.ptr;
    (pMVar3->type).d.d = (Data *)0x0;
    (pMVar3->type).d.ptr = (char16_t *)0x0;
    local_78.d.size = (pMVar3->type).d.size;
    (pMVar3->type).d.size = 0;
    std::
    queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
    ::pop(&this->pending);
    bVar10 = isMessageToBeShown(this,&local_58,&local_78);
    if (bVar10) {
      QTextEdit::setHtml(this->errors,&local_58);
      pQVar6 = &((this->currentMessage).d.d)->super_QArrayData;
      pcVar7 = (this->currentMessage).d.ptr;
      (this->currentMessage).d.d = local_58.d.d;
      (this->currentMessage).d.ptr = local_58.d.ptr;
      qVar4 = (this->currentMessage).d.size;
      (this->currentMessage).d.size = local_58.d.size;
      pQVar8 = &((this->currentType).d.d)->super_QArrayData;
      pcVar9 = (this->currentType).d.ptr;
      (this->currentType).d.d = local_78.d.d;
      (this->currentType).d.ptr = local_78.d.ptr;
      puVar5 = (undefined1 *)(this->currentType).d.size;
      (this->currentType).d.size = local_78.d.size;
      local_78.d.d = (Data *)pQVar8;
      local_78.d.ptr = pcVar9;
      local_78.d.size = (qsizetype)puVar5;
      local_58.d.d = (Data *)pQVar6;
      local_58.d.ptr = pcVar7;
      local_58.d.size = qVar4;
      QAbstractButton::setChecked(&this->again->super_QAbstractButton,true);
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  } while (!bVar10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pMVar2 != pMVar1;
  }
LAB_004dae9d:
  __stack_chk_fail();
}

Assistant:

bool QErrorMessagePrivate::nextPending()
{
    while (!pending.empty()) {
        QString message = std::move(pending.front().content);
        QString type = std::move(pending.front().type);
        pending.pop();
        if (isMessageToBeShown(message, type)) {
#ifndef QT_NO_TEXTHTMLPARSER
            errors->setHtml(message);
#else
            errors->setPlainText(message);
#endif
            currentMessage = std::move(message);
            currentType = std::move(type);
            again->setChecked(true);
            return true;
        }
    }
    return false;
}